

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base32.hpp
# Opt level: O0

string * pstore::base32::convert<pstore::uint128>(uint128 val)

{
  __type _Var1;
  __type _Var2;
  uint128 wide;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  bVar3;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RDX;
  base32 *in_RSI;
  string *in_RDI;
  undefined8 in_stack_ffffffffffffff68;
  int max_length;
  uint128 val_local;
  string *result;
  
  std::__cxx11::string::string(in_RDI);
  _Var1 = std::pow<double,int>(32.0,0x1a);
  _Var2 = std::pow<double,int>(2.0,0x80);
  if (_Var1 < _Var2) {
    assert_failed("std::pow (32.0, max_length) >= std::pow (2.0, 128)",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/base32.hpp"
                  ,0x44);
  }
  std::__cxx11::string::reserve((ulong)in_RDI);
  bVar3 = std::back_inserter<std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  wide.v_._8_8_ = bVar3.container;
  wide.v_._0_8_ = in_stack_ffffffffffffff68;
  convert<std::back_insert_iterator<std::__cxx11::string>>(in_RSI,wide,in_RDX);
  return in_RDI;
}

Assistant:

std::string convert (IntType val) {
            std::string result;
            auto const max_length = 26;
            PSTORE_ASSERT (std::pow (32.0, max_length) >= std::pow (2.0, 128));
            result.reserve (max_length);
            convert (val, std::back_inserter (result));
            return result;
        }